

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

bool ON_IsValidPointGrid(int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
                        int point_stride1,double *p)

{
  if ((p != (double *)0x0 && (0 < point_count1 && (0 < point_count0 && 0 < dim))) &&
     ((int)((uint)is_rat + dim) <= point_stride1 && (int)((uint)is_rat + dim) <= point_stride0)) {
    if (point_stride1 < point_stride0) {
      if (point_stride1 * point_count1 <= point_stride0) {
        return true;
      }
    }
    else if (point_stride0 * point_count0 <= point_stride1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool 
ON_IsValidPointGrid(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        const double* p
        )
{
  if ( dim < 1 || point_count0 < 1 || point_count1 < 1 || p == nullptr )
    return false;
  if ( is_rat )
    dim++;
  if ( point_stride0 < dim || point_stride1 < dim )
    return false;
  if ( point_stride0 <= point_stride1 ) {
    if ( point_stride1 < point_stride0*point_count0 )
      return false;
  }
  else {
    if ( point_stride0 < point_stride1*point_count1 )
      return false;
  }
  return true;
}